

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeObjectiveFunction.cpp
# Opt level: O1

DynamicVector<double,_std::allocator<double>_> * __thiscall
OpenMD::FluctuatingChargeObjectiveFunction::setInitialCoords
          (DynamicVector<double,_std::allocator<double>_> *__return_storage_ptr__,
          FluctuatingChargeObjectiveFunction *this)

{
  int *piVar1;
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar2;
  pointer piVar3;
  pointer ppAVar4;
  int *piVar5;
  Molecule *pMVar6;
  pointer ppAVar7;
  pointer pdVar8;
  int iVar9;
  long lVar10;
  Atom *pAVar11;
  allocator_type local_51;
  MoleculeIterator i;
  vector<int,_std::allocator<int>_> flucqOnProc_;
  
  piVar1 = &this->nproc_;
  MPI_Comm_size(&ompi_mpi_comm_world,piVar1);
  MPI_Comm_rank(&ompi_mpi_comm_world,&this->myrank_);
  i._M_node = (_Base_ptr)((ulong)i._M_node._4_4_ << 0x20);
  std::vector<int,_std::allocator<int>_>::vector
            (&flucqOnProc_,(long)this->nproc_,(value_type_conflict2 *)&i,&local_51);
  this_00 = &this->displacements_;
  piVar3 = (this->displacements_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->displacements_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (this->displacements_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  i._M_node = i._M_node & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)*piVar1,(value_type_conflict2 *)&i);
  i._M_node = (_Base_ptr)0x0;
  this->nFlucQ_ = 0;
  pMVar6 = SimInfo::beginMolecule(this->info_,&i);
  piVar2 = &this->nFlucQ_;
  do {
    if (pMVar6 == (Molecule *)0x0) {
      MPI_Allgather(piVar2,1,&ompi_mpi_int,
                    flucqOnProc_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,1,&ompi_mpi_int,&ompi_mpi_comm_world);
      *piVar2 = 0;
      if (0 < (long)*piVar1) {
        iVar9 = *piVar2;
        lVar10 = 0;
        do {
          iVar9 = iVar9 + flucqOnProc_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar10];
          *piVar2 = iVar9;
          lVar10 = lVar10 + 1;
        } while (*piVar1 != lVar10);
      }
      piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *piVar5 = 0;
      if (1 < *piVar1) {
        iVar9 = *piVar5;
        lVar10 = 1;
        do {
          iVar9 = iVar9 + flucqOnProc_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar10 + -1];
          piVar5[lVar10] = iVar9;
          lVar10 = lVar10 + 1;
        } while (lVar10 < *piVar1);
      }
      std::vector<double,_std::allocator<double>_>::vector
                (&__return_storage_ptr__->data_,(long)*piVar2,(allocator_type *)&local_51);
      iVar9 = (this->displacements_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[this->myrank_];
      pMVar6 = SimInfo::beginMolecule(this->info_,&i);
      while (pMVar6 != (Molecule *)0x0) {
        ppAVar7 = (pMVar6->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppAVar4 = (pMVar6->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppAVar7 == ppAVar4) {
          pAVar11 = (Atom *)0x0;
        }
        else {
          pAVar11 = *ppAVar7;
        }
        if (pAVar11 != (Atom *)0x0) {
          pdVar8 = (__return_storage_ptr__->data_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar9;
          do {
            ppAVar7 = ppAVar7 + 1;
            *pdVar8 = *(double *)
                       (*(long *)((long)&(((pAVar11->super_StuntDouble).snapshotMan_)->
                                          currentSnapshot_->atomData).flucQPos.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start +
                                 (pAVar11->super_StuntDouble).storage_) +
                       (long)(pAVar11->super_StuntDouble).localIndex_ * 8);
            if (ppAVar7 == ppAVar4) {
              pAVar11 = (Atom *)0x0;
            }
            else {
              pAVar11 = *ppAVar7;
            }
            pdVar8 = pdVar8 + 1;
            iVar9 = iVar9 + 1;
          } while (pAVar11 != (Atom *)0x0);
        }
        pMVar6 = SimInfo::nextMolecule(this->info_,&i);
      }
      MPI_Allgatherv(1,0,&ompi_mpi_datatype_null,
                     (__return_storage_ptr__->data_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     flucqOnProc_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start,&ompi_mpi_double,&ompi_mpi_comm_world);
      if (flucqOnProc_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(flucqOnProc_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)flucqOnProc_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)flucqOnProc_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    ppAVar7 = (pMVar6->fluctuatingCharges_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppAVar4 = (pMVar6->fluctuatingCharges_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ppAVar7 != ppAVar4) && (*ppAVar7 != (Atom *)0x0)) {
      iVar9 = *piVar2;
      do {
        iVar9 = iVar9 + 1;
        ppAVar7 = ppAVar7 + 1;
        if (ppAVar7 == ppAVar4) break;
      } while (*ppAVar7 != (Atom *)0x0);
      *piVar2 = iVar9;
    }
    pMVar6 = SimInfo::nextMolecule(this->info_,&i);
  } while( true );
}

Assistant:

DynamicVector<RealType>
      FluctuatingChargeObjectiveFunction::setInitialCoords() {
#ifdef IS_MPI
    MPI_Comm_size(MPI_COMM_WORLD, &nproc_);
    MPI_Comm_rank(MPI_COMM_WORLD, &myrank_);
    std::vector<int> flucqOnProc_(nproc_, 0);

    displacements_.clear();
    displacements_.resize(nproc_, 0);
#endif

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;

    nFlucQ_ = 0;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        nFlucQ_++;
      }
    }

#ifdef IS_MPI
    MPI_Allgather(&nFlucQ_, 1, MPI_INT, &flucqOnProc_[0], 1, MPI_INT,
                  MPI_COMM_WORLD);

    nFlucQ_ = 0;
    for (int iproc = 0; iproc < nproc_; iproc++) {
      nFlucQ_ += flucqOnProc_[iproc];
    }

    displacements_[0] = 0;
    for (int iproc = 1; iproc < nproc_; iproc++) {
      displacements_[iproc] =
          displacements_[iproc - 1] + flucqOnProc_[iproc - 1];
    }
#endif

    DynamicVector<RealType> initCoords(nFlucQ_);

    int index;
#ifdef IS_MPI
    index = displacements_[myrank_];
#else
    index = 0;
#endif

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        initCoords[index++] = atom->getFlucQPos();
      }
    }

#ifdef IS_MPI
    MPI_Allgatherv(MPI_IN_PLACE, 0, MPI_DATATYPE_NULL, &initCoords[0],
                   &flucqOnProc_[0], &displacements_[0], MPI_REALTYPE,
                   MPI_COMM_WORLD);
#endif

    return initCoords;
  }